

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

cram_block * cram_read_block(cram_fd *fd)

{
  uint uVar1;
  byte bVar2;
  cram_block_method cVar3;
  cram_content_type cVar4;
  int iVar5;
  undefined4 uVar6;
  uint32_t uVar7;
  byte bVar12;
  cram_block *__ptr;
  byte *pbVar8;
  uchar *puVar9;
  ulong __n;
  size_t sVar10;
  long lVar11;
  byte bVar13;
  byte bVar14;
  byte *pbVar15;
  byte *pbVar16;
  ulong uVar17;
  hFILE *phVar18;
  ulong __size;
  size_t __size_00;
  uchar dat [100];
  undefined1 local_98;
  undefined1 local_97;
  byte local_96 [102];
  
  __ptr = (cram_block *)malloc(0x40);
  if (__ptr == (cram_block *)0x0) {
    return (cram_block *)0x0;
  }
  phVar18 = fd->fp;
  pbVar16 = (byte *)phVar18->begin;
  pbVar15 = (byte *)phVar18->end;
  if (pbVar16 < pbVar15) {
    pbVar8 = pbVar16 + 1;
    phVar18->begin = (char *)pbVar8;
    __ptr->method = (uint)*pbVar16;
  }
  else {
    cVar3 = hgetc2(phVar18);
    __ptr->method = cVar3;
    if (cVar3 == ERROR) goto LAB_00127533;
    phVar18 = fd->fp;
    pbVar8 = (byte *)phVar18->begin;
    pbVar15 = (byte *)phVar18->end;
  }
  if (pbVar8 < pbVar15) {
    phVar18->begin = (char *)(pbVar8 + 1);
    __ptr->content_type = (uint)*pbVar8;
  }
  else {
    cVar4 = hgetc2(phVar18);
    __ptr->content_type = cVar4;
    if (cVar4 == CT_ERROR) goto LAB_00127533;
  }
  iVar5 = itf8_decode(fd,&__ptr->content_id);
  if (iVar5 == -1) goto LAB_00127533;
  iVar5 = itf8_decode(fd,&__ptr->comp_size);
  if (iVar5 == -1) goto LAB_00127533;
  iVar5 = itf8_decode(fd,&__ptr->uncomp_size);
  if (iVar5 == -1) goto LAB_00127533;
  cVar3 = __ptr->method;
  if (cVar3 == RAW) {
    __size_00 = (size_t)__ptr->uncomp_size;
    __ptr->alloc = __size_00;
    puVar9 = (uchar *)malloc(__size_00);
    __ptr->data = puVar9;
    if (puVar9 == (uchar *)0x0) goto LAB_00127533;
    sVar10 = hread(fd->fp,puVar9,__size_00);
    if (sVar10 != __size_00) goto LAB_0012752e;
  }
  else {
    __size = (ulong)__ptr->comp_size;
    __ptr->alloc = __size;
    puVar9 = (uchar *)malloc(__size);
    __ptr->data = puVar9;
    if (puVar9 == (uchar *)0x0) goto LAB_00127533;
    phVar18 = fd->fp;
    uVar17 = (long)phVar18->end - (long)phVar18->begin;
    __n = __size;
    if (uVar17 < __size) {
      __n = uVar17;
    }
    memcpy(puVar9,phVar18->begin,__n);
    phVar18->begin = phVar18->begin + __n;
    if (uVar17 < __size) {
      __n = hread2(phVar18,puVar9,__size,__n);
    }
    if (__n != __size) {
LAB_0012752e:
      free(puVar9);
      goto LAB_00127533;
    }
  }
  if (0x2ff < fd->version) {
    iVar5 = int32_decode(fd,(int32_t *)&__ptr->crc32);
    if (iVar5 == -1) {
LAB_00127533:
      free(__ptr);
      return (cram_block *)0x0;
    }
    cVar3 = __ptr->method;
    local_98 = (undefined1)cVar3;
    local_97 = (undefined1)__ptr->content_type;
    uVar1 = __ptr->content_id;
    bVar2 = (byte)uVar1;
    if (uVar1 < 0x80) {
      lVar11 = 1;
      local_96[0] = bVar2;
    }
    else {
      bVar12 = (byte)(uVar1 >> 8);
      if (uVar1 < 0x4000) {
        local_96[0] = bVar12 | 0x80;
        lVar11 = 2;
        local_96[1] = bVar2;
      }
      else {
        local_96[1] = (byte)(uVar1 >> 0x10);
        if (uVar1 < 0x200000) {
          local_96[0] = local_96[1] | 0xc0;
          lVar11 = 3;
          local_96[1] = bVar12;
          local_96[2] = bVar2;
        }
        else {
          local_96[0] = (byte)(uVar1 >> 0x18);
          if (uVar1 < 0x10000000) {
            local_96[0] = local_96[0] | 0xe0;
            lVar11 = 4;
            local_96[2] = bVar12;
            local_96[3] = bVar2;
          }
          else {
            local_96[0] = local_96[0] >> 4 | 0xf0;
            local_96[1] = (byte)(uVar1 >> 0x14);
            local_96[2] = (byte)(uVar1 >> 0xc);
            local_96[3] = (byte)(uVar1 >> 4);
            local_96[4] = bVar2 & 0xf;
            lVar11 = 5;
          }
        }
      }
    }
    pbVar16 = local_96 + lVar11;
    uVar1 = __ptr->comp_size;
    bVar2 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *pbVar16 = bVar2;
      lVar11 = 1;
    }
    else {
      bVar12 = (byte)(uVar1 >> 8);
      if (uVar1 < 0x4000) {
        *pbVar16 = bVar12 | 0x80;
        local_96[lVar11 + 1] = bVar2;
        lVar11 = 2;
      }
      else {
        bVar13 = (byte)(uVar1 >> 0x10);
        if (uVar1 < 0x200000) {
          *pbVar16 = bVar13 | 0xc0;
          local_96[lVar11 + 1] = bVar12;
          local_96[lVar11 + 2] = bVar2;
          lVar11 = 3;
        }
        else {
          bVar14 = (byte)(uVar1 >> 0x18);
          if (uVar1 < 0x10000000) {
            *pbVar16 = bVar14 | 0xe0;
            local_96[lVar11 + 1] = bVar13;
            local_96[lVar11 + 2] = bVar12;
            local_96[lVar11 + 3] = bVar2;
            lVar11 = 4;
          }
          else {
            *pbVar16 = bVar14 >> 4 | 0xf0;
            local_96[lVar11 + 1] = (byte)(uVar1 >> 0x14);
            local_96[lVar11 + 2] = (byte)(uVar1 >> 0xc);
            local_96[lVar11 + 3] = (byte)(uVar1 >> 4);
            local_96[lVar11 + 4] = bVar2 & 0xf;
            lVar11 = 5;
          }
        }
      }
    }
    pbVar16 = pbVar16 + lVar11;
    uVar1 = __ptr->uncomp_size;
    bVar2 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *pbVar16 = bVar2;
      iVar5 = 1;
    }
    else {
      bVar12 = (byte)(uVar1 >> 8);
      if (uVar1 < 0x4000) {
        *pbVar16 = bVar12 | 0x80;
        pbVar16[1] = bVar2;
        iVar5 = 2;
      }
      else {
        bVar13 = (byte)(uVar1 >> 0x10);
        if (uVar1 < 0x200000) {
          *pbVar16 = bVar13 | 0xc0;
          pbVar16[1] = bVar12;
          pbVar16[2] = bVar2;
          iVar5 = 3;
        }
        else {
          bVar14 = (byte)(uVar1 >> 0x18);
          if (uVar1 < 0x10000000) {
            *pbVar16 = bVar14 | 0xe0;
            pbVar16[1] = bVar13;
            pbVar16[2] = bVar12;
            pbVar16[3] = bVar2;
            iVar5 = 4;
          }
          else {
            *pbVar16 = bVar14 >> 4 | 0xf0;
            pbVar16[1] = (byte)(uVar1 >> 0x14);
            pbVar16[2] = (byte)(uVar1 >> 0xc);
            pbVar16[3] = (byte)(uVar1 >> 4);
            pbVar16[4] = bVar2 & 0xf;
            iVar5 = 5;
          }
        }
      }
    }
    uVar6 = crc32(0,&local_98,((int)pbVar16 + iVar5) - (int)&local_98);
    puVar9 = "";
    if (__ptr->data != (uchar *)0x0) {
      puVar9 = __ptr->data;
    }
    uVar7 = crc32(uVar6,puVar9,(int)__ptr->alloc);
    if (__ptr->crc32 != uVar7) {
      cram_read_block_cold_1();
      return (cram_block *)0x0;
    }
  }
  __ptr->orig_method = cVar3;
  __ptr->idx = 0;
  __ptr->byte = 0;
  __ptr->bit = 7;
  return __ptr;
}

Assistant:

cram_block *cram_read_block(cram_fd *fd) {
    cram_block *b = malloc(sizeof(*b));
    if (!b)
	return NULL;

    //fprintf(stderr, "Block at %d\n", (int)ftell(fd->fp));

    if (-1 == (b->method      = hgetc(fd->fp))) { free(b); return NULL; }
    if (-1 == (b->content_type= hgetc(fd->fp))) { free(b); return NULL; }
    if (-1 == itf8_decode(fd, &b->content_id))  { free(b); return NULL; }
    if (-1 == itf8_decode(fd, &b->comp_size))   { free(b); return NULL; }
    if (-1 == itf8_decode(fd, &b->uncomp_size)) { free(b); return NULL; }

    //    fprintf(stderr, "  method %d, ctype %d, cid %d, csize %d, ucsize %d\n",
    //	    b->method, b->content_type, b->content_id, b->comp_size, b->uncomp_size);

    if (b->method == RAW) {
	b->alloc = b->uncomp_size;
	if (!(b->data = malloc(b->uncomp_size))){ free(b); return NULL; }
	if (b->uncomp_size != hread(fd->fp, b->data, b->uncomp_size)) {
	    free(b->data);
	    free(b);
	    return NULL;
	}
    } else {
	b->alloc = b->comp_size;
	if (!(b->data = malloc(b->comp_size)))  { free(b); return NULL; }
	if (b->comp_size != hread(fd->fp, b->data, b->comp_size)) {
	    free(b->data);
	    free(b);
	    return NULL;
	}
    }

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	unsigned char dat[100], *cp = dat;;
	uint32_t crc;

	
	if (-1 == int32_decode(fd, (int32_t *)&b->crc32)) {
	    free(b);
	    return NULL;
	}

	*cp++ = b->method;
	*cp++ = b->content_type;
	cp += itf8_put(cp, b->content_id);
	cp += itf8_put(cp, b->comp_size);
	cp += itf8_put(cp, b->uncomp_size);
	crc = crc32(0L, dat, cp-dat);
	crc = crc32(crc, b->data ? b->data : (uc *)"", b->alloc);

	if (crc != b->crc32) {
	    fprintf(stderr, "Block CRC32 failure\n");
	    free(b->data);
	    free(b);
	    return NULL;
	}
    }

    b->orig_method = b->method;
    b->idx = 0;
    b->byte = 0;
    b->bit = 7; // MSB

    return b;
}